

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwnsc.cpp
# Opt level: O3

string * GetNwnInstallPath_abi_cxx11_(string *__return_storage_ptr__,int CompilerVersion,bool Quiet)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  char *__s;
  long *plVar6;
  Writer *pWVar7;
  JSONValue *this;
  _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
  *__x;
  iterator iVar8;
  mapped_type *ppJVar9;
  JSONArray *__x_00;
  _func_int **pp_Var10;
  size_type *psVar11;
  pointer pwVar12;
  pointer __rhs;
  string RootDir;
  string GameStr;
  string KeyFile;
  string settingsFile;
  JSONArray array;
  JSONObject root;
  string str;
  stringstream buffer;
  string SteamRootDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  key_type local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  char *local_4e0;
  undefined8 local_4d8;
  char local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  LineNumber local_4a0;
  char *local_498;
  VerboseLevel local_490;
  Logger *local_488;
  bool local_480;
  Logger *local_478;
  char *local_470;
  DispatchAction local_468;
  pointer local_460;
  pointer pbStack_458;
  pointer local_450;
  vector<JSONValue_*,_std::allocator<JSONValue_*>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
  local_410;
  char *local_3e0;
  char local_3d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [4];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  LineNumber local_218;
  char *local_210;
  VerboseLevel local_208;
  Logger *local_200;
  bool local_1f8;
  Logger *local_1f0;
  char *local_1e8;
  DispatchAction local_1e0;
  pointer local_1d8;
  pointer pbStack_1d0;
  pointer local_1c8;
  
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  local_540._M_string_length = 0;
  local_540.field_2._M_local_buf[0] = '\0';
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  local_500._M_string_length = 0;
  local_500.field_2._M_local_buf[0] = '\0';
  __s = getenv("NWN_ROOT");
  if (__s == (char *)0x0) {
    if (CompilerVersion < 0xae) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      local_4e0 = local_4d0;
      local_4d8 = 0;
      local_4d0[0] = '\0';
      GetHomeDirectory_abi_cxx11_();
      plVar6 = (long *)std::__cxx11::string::append((char *)local_3c0);
      pp_Var10 = (_func_int **)(plVar6 + 2);
      if ((_func_int **)*plVar6 == pp_Var10) {
        local_228._0_8_ = *pp_Var10;
        local_228._8_8_ = plVar6[3];
        local_238._0_8_ = local_228;
      }
      else {
        local_228._0_8_ = *pp_Var10;
        local_238._0_8_ = (_func_int **)*plVar6;
      }
      local_238._8_8_ = plVar6[1];
      *plVar6 = (long)pp_Var10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_4e0,(string *)local_238);
      if ((undefined1 *)local_238._0_8_ != local_228) {
        operator_delete((void *)local_238._0_8_);
      }
      paVar1 = &local_3c0[0].field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0[0]._M_dataplus._M_p);
      }
      local_238._0_8_ = &PTR__Writer_00192a68;
      local_238._8_8_ = (LogMessage *)0x0;
      local_228._0_4_ = 4;
      local_228._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/nwnsc/nwnsc.cpp";
      local_218 = 0x113;
      local_210 = "std::string GetNwnInstallPath(int, bool)";
      local_208 = 0;
      local_200 = (Logger *)0x0;
      local_1f8 = false;
      local_1f0 = (Logger *)0x0;
      local_1e8 = "";
      local_1e0 = NormalLog;
      local_1d8 = (pointer)0x0;
      pbStack_1d0 = (pointer)0x0;
      local_1c8 = (pointer)0x0;
      pWVar7 = el::base::Writer::construct((Writer *)local_238,1,"default");
      bVar3 = pWVar7->m_proceed;
      if ((bool)bVar3 == true) {
        el::base::MessageBuilder::operator<<(&pWVar7->m_messageBuilder," settingsFile ");
        bVar3 = pWVar7->m_proceed;
      }
      if ((bVar3 & 1) != 0) {
        el::base::MessageBuilder::operator<<(&pWVar7->m_messageBuilder,local_4e0);
      }
      el::base::Writer::~Writer((Writer *)local_238);
      iVar5 = access(local_4e0,0);
      if (iVar5 == 0) {
        std::ifstream::ifstream(local_238,(string *)&local_4e0,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
        std::ostream::operator<<(&local_3c0[0].field_2,(streambuf *)local_228);
        std::__cxx11::stringbuf::str();
        this = JSON::Parse(local_3e0);
        if (this != (JSONValue *)0x0) {
          p_Var2 = &local_410._M_impl.super__Rb_tree_header;
          local_410._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_410._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_410._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_410._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
          local_410._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
          bVar4 = JSONValue::IsObject(this);
          if (bVar4) {
            __x = &JSONValue::AsObject_abi_cxx11_(this)->_M_t;
            std::
            _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
            ::operator=(&local_410,__x);
            local_4c0._0_8_ = local_4c0 + 0x10;
            std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_4c0,L"folders",L"")
            ;
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                    ::find(&local_410,(key_type *)local_4c0);
            if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
              bVar4 = false;
            }
            else {
              local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
              std::__cxx11::wstring::_M_construct<wchar_t_const*>
                        ((wstring *)&local_520,L"folders",L"");
              ppJVar9 = std::
                        map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                      *)&local_410,&local_520);
              bVar4 = JSONValue::IsArray(*ppJVar9);
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_520._M_dataplus._M_p != &local_520.field_2) {
                operator_delete(local_520._M_dataplus._M_p);
              }
            }
            if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
              operator_delete((void *)local_4c0._0_8_);
            }
            if (bVar4 != false) {
              local_4c0._0_8_ = local_4c0 + 0x10;
              std::__cxx11::wstring::_M_construct<wchar_t_const*>
                        ((wstring *)local_4c0,L"folders",L"");
              ppJVar9 = std::
                        map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                      *)&local_410,(key_type *)local_4c0);
              __x_00 = JSONValue::AsArray(*ppJVar9);
              std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::vector(&local_448,__x_00);
              if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
                operator_delete((void *)local_4c0._0_8_);
              }
              if (local_448.super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_448.super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                JSONValue::AsString_abi_cxx11_
                          (&local_520,
                           *local_448.super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
                ws2s((string *)local_4c0,&local_520);
                std::__cxx11::string::operator=((string *)&local_540,(string *)local_4c0);
                if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
                  operator_delete((void *)local_4c0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_520._M_dataplus._M_p != &local_520.field_2) {
                  operator_delete(local_520._M_dataplus._M_p);
                }
              }
              std::__cxx11::string::push_back((char)&local_540);
              local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
              local_520._M_string_length = 0;
              local_520.field_2._M_local_buf[0]._0_1_ = 0;
              if (NwnVersions_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  NwnVersions_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                __rhs = NwnVersions_abi_cxx11_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
                do {
                  std::operator+(&local_430,&local_540,&__rhs->first);
                  plVar6 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_430,(ulong)local_500._M_dataplus._M_p);
                  pwVar12 = (pointer)(plVar6 + 2);
                  if ((pointer)*plVar6 == pwVar12) {
                    local_4b0._0_8_ = *(undefined8 *)pwVar12;
                    local_4b0._8_8_ = plVar6[3];
                    local_4c0._0_8_ = local_4c0 + 0x10;
                  }
                  else {
                    local_4b0._0_8_ = *(undefined8 *)pwVar12;
                    local_4c0._0_8_ = (pointer)*plVar6;
                  }
                  local_4c0._8_8_ = plVar6[1];
                  *plVar6 = (long)pwVar12;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  iVar5 = access((char *)local_4c0._0_8_,0);
                  if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
                    operator_delete((void *)local_4c0._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_430._M_dataplus._M_p != &local_430.field_2) {
                    operator_delete(local_430._M_dataplus._M_p);
                  }
                  if (iVar5 == 0) {
                    std::__cxx11::string::_M_append
                              ((char *)&local_540,(ulong)(__rhs->first)._M_dataplus._M_p);
                    std::__cxx11::string::push_back((char)&local_540);
                    std::__cxx11::string::_M_assign((string *)&local_520);
                    break;
                  }
                  __rhs = __rhs + 1;
                } while (__rhs != NwnVersions_abi_cxx11_.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
              }
              local_4c0._0_8_ = &PTR__Writer_00192a68;
              local_4c0._8_8_ = (LogMessage *)0x0;
              local_4b0._0_4_ = 4;
              local_4b0._8_8_ =
                   "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/nwnsc/nwnsc.cpp"
              ;
              local_4a0 = 0x143;
              local_498 = "std::string GetNwnInstallPath(int, bool)";
              local_490 = 0;
              local_488 = (Logger *)0x0;
              local_480 = false;
              local_478 = (Logger *)0x0;
              local_470 = "";
              local_468 = NormalLog;
              local_460 = (pointer)0x0;
              pbStack_458 = (pointer)0x0;
              local_450 = (pointer)0x0;
              pWVar7 = el::base::Writer::construct((Writer *)local_4c0,1,"default");
              bVar3 = pWVar7->m_proceed;
              if ((bool)bVar3 == true) {
                el::base::MessageBuilder::operator<<(&pWVar7->m_messageBuilder," RootDir ");
                bVar3 = pWVar7->m_proceed;
              }
              if ((bVar3 & 1) != 0) {
                el::base::MessageBuilder::operator<<
                          (&pWVar7->m_messageBuilder,local_540._M_dataplus._M_p);
              }
              el::base::Writer::~Writer((Writer *)local_4c0);
              if (!Quiet) {
                PrintfTextOut::WriteText
                          (&g_TextOut,"Base game %s location - %s\n",local_520._M_dataplus._M_p,
                           local_540._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_520._M_dataplus._M_p != &local_520.field_2) {
                operator_delete(local_520._M_dataplus._M_p);
              }
              if (local_448.super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_448.
                                super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
          ::~_Rb_tree(&local_410);
        }
        if (local_3e0 != local_3d0) {
          operator_delete(local_3e0);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
        std::ios_base::~ios_base(local_340);
        std::ifstream::~ifstream(local_238);
      }
      else {
        local_238._8_8_ = (LogMessage *)0x0;
        local_228._0_8_ = local_228._0_8_ & 0xffffffffffffff00;
        local_238._0_8_ = local_228;
        GetHomeDirectory_abi_cxx11_();
        plVar6 = (long *)std::__cxx11::string::append(local_4c0);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_3c0[0].field_2._0_8_ = *psVar11;
          local_3c0[0].field_2._8_8_ = plVar6[3];
          local_3c0[0]._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_3c0[0].field_2._0_8_ = *psVar11;
          local_3c0[0]._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_3c0[0]._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_238,(string *)local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_3c0[0]._M_dataplus._M_p);
        }
        if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
          operator_delete((void *)local_4c0._0_8_);
        }
        std::operator+(local_3c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238,&local_500);
        iVar5 = access(local_3c0[0]._M_dataplus._M_p,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_3c0[0]._M_dataplus._M_p);
        }
        if (iVar5 == 0) {
          std::__cxx11::string::_M_assign((string *)&local_540);
        }
        if ((undefined1 *)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      paVar1 = &local_540.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                      local_540.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_540.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_540._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                      local_540.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_540._M_string_length;
      local_540._M_string_length = 0;
      local_540.field_2._M_local_buf[0] = '\0';
      local_540._M_dataplus._M_p = (pointer)paVar1;
      if (local_4e0 != local_4d0) {
        operator_delete(local_4e0);
      }
    }
  }
  else {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_540,0,(char *)0x0,(ulong)__s);
    if (local_540._M_dataplus._M_p[local_540._M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)&local_540);
    }
    std::__cxx11::string::_M_replace
              ((ulong)&local_500,0,(char *)local_500._M_string_length,0x1741fe);
    if (!Quiet) {
      PrintfTextOut::WriteText
                (&g_TextOut,"Base game location from NWN_ROOT - %s\n",local_540._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p == &local_540.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,local_540.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_540.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_540._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,local_540.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = local_540._M_string_length;
    local_540._M_string_length = 0;
    local_540.field_2._M_local_buf[0] = '\0';
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
GetNwnInstallPath(int CompilerVersion, bool Quiet)
/*++

Routine Description:

	This routine attempts to auto detect the NWN1 installation path from the
	registry.

Arguments:

	None.

Return Value:

	The routine returns the game installation path if successful.  Otherwise,
	an std::exception is raised.

Environment:

	User mode.

--*/
{
    std::string RootDir;
    char *EnvNwnRoot;
    std::string KeyFile;

    EnvNwnRoot = getenv("NWN_ROOT");

    if (EnvNwnRoot != NULL) {
        RootDir = EnvNwnRoot;
#if defined(_WINDOWS)
        if (RootDir.back() != '\\')
            RootDir.push_back( '\\' );
        KeyFile = "\\data\\nwn_base.key";
#else
        if (RootDir.back() != '/')
            RootDir.push_back('/');
        KeyFile = "/data/nwn_base.key";
#endif
        if (!Quiet) {
            g_TextOut.WriteText("Base game location from NWN_ROOT - %s\n", RootDir.c_str());
        }
        return RootDir;
    } else {
        if (CompilerVersion >= 174) {

            std::string settingsFile;

#if defined(__APPLE__)
            settingsFile = GetHomeDirectory() + "/Library/Application Support/Beamdog Client/settings.json";
#elif defined(__linux__)
            settingsFile = GetHomeDirectory() + "/.config/Beamdog Client/settings.json";
#elif defined(_WINDOWS)
			settingsFile = GetHomeDirectory() + "\\Beamdog Client\\settings.json";
#endif
            LOG(DEBUG) << " settingsFile " << settingsFile;

            if (FileExists(settingsFile)) {
                std::ifstream InStream(settingsFile, std::ifstream::in);
                std::stringstream buffer;
                buffer << InStream.rdbuf();

                std::string str(buffer.str());

                // Parse data
                JSONValue *value = JSON::Parse(str.c_str());

                if (value != NULL) {

                    JSONObject root;
                    if (value->IsObject() != false) {
                        root = value->AsObject();

                        // Retrieving an array
                        if (root.find(L"folders") != root.end() && root[L"folders"]->IsArray()) {
                            JSONArray array = root[L"folders"]->AsArray();

                            if (array.size() > 0) {
                                RootDir = ws2s(array[0]->AsString());
                            }

#ifdef _WINDOWS
                            RootDir.push_back('\\');
#else
                            RootDir.push_back('/');
#endif

                            std::string GameStr;

                            std::vector<std::pair<std::string, std::string>>::iterator it;  // declare an iterator to a vector of strings
                            for (it = NwnVersions.begin(); it != NwnVersions.end(); it++) {
                                if (FileExists(RootDir + it->first + KeyFile)) {
                                    RootDir += it->first;
#ifdef _WINDOWS
                                    RootDir.push_back('\\');
#else
                                    RootDir.push_back('/');
#endif
                                    GameStr = it->second;
                                    break;
                                }
                            }

                            LOG(DEBUG) << " RootDir " << RootDir;
                            if (!Quiet) {
                                g_TextOut.WriteText("Base game %s location - %s\n", GameStr.c_str(), RootDir.c_str());
                            }
                        }

                    }
                }
            } else {
                std::string SteamRootDir;
#if defined(__APPLE__)
                SteamRootDir = GetHomeDirectory() + "/Library/Application Support/Steam/steamapps/common/Neverwinter Nights/";
#elif defined(__linux__)
                SteamRootDir = GetHomeDirectory() + "/.local/share/Steam/steamapps/common/Neverwinter Nights/";
#elif defined(_WINDOWS)
                SteamRootDir = "C:\\Program Files (x86)\\Steam\\steamapps\\common\\Neverwinter Nights\\";
#endif
                if (FileExists(SteamRootDir + KeyFile))
                    RootDir = SteamRootDir;
            }
            return RootDir;

        } else {
#if defined(_WINDOWS)
            HKEY Key;
            LONG Status;

            Status = RegOpenKeyEx(
                HKEY_LOCAL_MACHINE,
                "SOFTWARE\\BioWare\\NWN\\Neverwinter",
                REG_OPTION_RESERVED,
#ifdef _WIN64
                KEY_QUERY_VALUE | KEY_WOW64_32KEY,
#else
                KEY_QUERY_VALUE,
#endif
                &Key);

            if (Status != NO_ERROR)
                throw std::runtime_error( "Unable to open NWN registry key" );

            try
            {
                    CHAR                NameBuffer[ MAX_PATH + 1 ];
                    DWORD               NameBufferSize;
                    bool                FoundIt;
                    static const char * ValueNames[ ] =
                    {
                        "Path",     // Retail NWN
                        "Location", // Steam NWN
                    };

                    FoundIt = false;

                    for (size_t i = 0; i < _countof( ValueNames ); i += 1)
                    {
                        NameBufferSize = sizeof( NameBuffer ) - sizeof( NameBuffer[ 0 ] );

                        Status = RegQueryValueExA(
                            Key,
                            ValueNames[ i ],
                            nullptr,
                            nullptr,
                            (LPBYTE) NameBuffer,
                            &NameBufferSize);

                        if (Status != NO_ERROR)
                            continue;

                        //
                        // Strip trailing nullptr byte if it exists.
                        //

                        if ((NameBufferSize > 0) &&
                            (NameBuffer[ NameBufferSize - 1 ] == '\0'))
                            NameBufferSize -= 1;

                        std::string NwnRootDir = std::string( NameBuffer, NameBufferSize );

                        if (!Quiet) {
                            g_TextOut.WriteText("Base game location - %s\n", NwnRootDir.c_str());
                        }

                        return NwnRootDir;
                    }

                    throw std::exception( "Unable to read Path from NWN registry key" );
            }
            catch (...)
            {
                RegCloseKey( Key );
                throw;
            }
#else
            return "";
#endif
        }
    }
}